

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void ReportOutput(lemon *lemp)

{
  state *psVar1;
  action *ap;
  symbol *psVar2;
  rule *rp;
  int iVar3;
  FILE *__s;
  size_t sVar4;
  long lVar5;
  rule **pprVar6;
  config *cfp;
  action **ppaVar7;
  ulong uVar8;
  char buf [20];
  
  __s = (FILE *)file_open(lemp,".out","wb");
  if (__s != (FILE *)0x0) {
    for (lVar5 = 0; lVar5 < lemp->nxstate; lVar5 = lVar5 + 1) {
      psVar1 = lemp->sorted[lVar5];
      fprintf(__s,"State %d:\n",(ulong)(uint)psVar1->statenum);
      for (cfp = (&psVar1->bp)[lemp->basisflag == 0]; cfp != (config *)0x0;
          cfp = (&cfp->next)[lemp->basisflag != 0]) {
        if (cfp->dot == cfp->rp->nrhs) {
          lemon_sprintf(buf,"(%d)",(ulong)(uint)cfp->rp->iRule);
          fprintf(__s,"    %5s ",buf);
        }
        else {
          fwrite("          ",10,1,__s);
        }
        ConfigPrint((FILE *)__s,cfp);
        fputc(10,__s);
      }
      fputc(10,__s);
      ppaVar7 = &psVar1->ap;
      while (ap = *ppaVar7, ap != (action *)0x0) {
        iVar3 = PrintAction(ap,(FILE *)__s,0x1e);
        if (iVar3 != 0) {
          fputc(10,__s);
        }
        ppaVar7 = &ap->next;
      }
      fputc(10,__s);
    }
    fwrite("----------------------------------------------------\n",0x35,1,__s);
    fwrite("Symbols:\n",9,1,__s);
    fwrite("The first-set of non-terminals is shown after the name.\n\n",0x39,1,__s);
    for (uVar8 = 0; (long)uVar8 < (long)lemp->nsymbol; uVar8 = uVar8 + 1) {
      psVar2 = lemp->symbols[uVar8];
      fprintf(__s,"  %3d: %s",uVar8 & 0xffffffff,psVar2->name);
      if (psVar2->type == NONTERMINAL) {
        fputc(0x3a,__s);
        if (psVar2->lambda != LEMON_FALSE) {
          fwrite(" <lambda>",9,1,__s);
        }
        for (lVar5 = 0; lVar5 < lemp->nterminal; lVar5 = lVar5 + 1) {
          if ((psVar2->firstset != (char *)0x0) && (psVar2->firstset[lVar5] != '\0')) {
            fprintf(__s," %s",lemp->symbols[lVar5]->name);
          }
        }
      }
      if (-1 < psVar2->prec) {
        fprintf(__s," (precedence=%d)");
      }
      fputc(10,__s);
    }
    fwrite("----------------------------------------------------\n",0x35,1,__s);
    fwrite("Syntax-only Symbols:\n",0x15,1,__s);
    fwrite("The following symbols never carry semantic content.\n\n",0x35,1,__s);
    iVar3 = 0;
    for (lVar5 = 0; lVar5 < lemp->nsymbol; lVar5 = lVar5 + 1) {
      psVar2 = lemp->symbols[lVar5];
      if (psVar2->bContent == 0) {
        sVar4 = strlen(psVar2->name);
        if ((iVar3 < 1) || (iVar3 + (int)sVar4 < 0x4c)) {
          if (0 < iVar3) {
            fputc(0x20,__s);
            iVar3 = iVar3 + 1;
          }
        }
        else {
          fputc(10,__s);
          iVar3 = 0;
        }
        fputs(psVar2->name,__s);
        iVar3 = iVar3 + (int)sVar4;
      }
    }
    if (0 < iVar3) {
      fputc(10,__s);
    }
    fwrite("----------------------------------------------------\n",0x35,1,__s);
    fwrite("Rules:\n",7,1,__s);
    pprVar6 = &lemp->rule;
    while (rp = *pprVar6, rp != (rule *)0x0) {
      fprintf(__s,"%4d: ",(ulong)(uint)rp->iRule);
      rule_print((FILE *)__s,rp);
      fputc(0x2e,__s);
      psVar2 = rp->precsym;
      if (psVar2 != (symbol *)0x0) {
        fprintf(__s," [%s precedence=%d]",psVar2->name,(ulong)(uint)psVar2->prec);
      }
      fputc(10,__s);
      pprVar6 = &rp->next;
    }
    fclose(__s);
  }
  return;
}

Assistant:

void ReportOutput(struct lemon *lemp)
{
  int i, n;
  struct state *stp;
  struct config *cfp;
  struct action *ap;
  struct rule *rp;
  FILE *fp;

  fp = file_open(lemp,".out","wb");
  if( fp==0 ) return;
  for(i=0; i<lemp->nxstate; i++){
    stp = lemp->sorted[i];
    fprintf(fp,"State %d:\n",stp->statenum);
    if( lemp->basisflag ) cfp=stp->bp;
    else                  cfp=stp->cfp;
    while( cfp ){
      char buf[20];
      if( cfp->dot==cfp->rp->nrhs ){
        lemon_sprintf(buf,"(%d)",cfp->rp->iRule);
        fprintf(fp,"    %5s ",buf);
      }else{
        fprintf(fp,"          ");
      }
      ConfigPrint(fp,cfp);
      fprintf(fp,"\n");
#if 0
      SetPrint(fp,cfp->fws,lemp);
      PlinkPrint(fp,cfp->fplp,"To  ");
      PlinkPrint(fp,cfp->bplp,"From");
#endif
      if( lemp->basisflag ) cfp=cfp->bp;
      else                  cfp=cfp->next;
    }
    fprintf(fp,"\n");
    for(ap=stp->ap; ap; ap=ap->next){
      if( PrintAction(ap,fp,30) ) fprintf(fp,"\n");
    }
    fprintf(fp,"\n");
  }
  fprintf(fp, "----------------------------------------------------\n");
  fprintf(fp, "Symbols:\n");
  fprintf(fp, "The first-set of non-terminals is shown after the name.\n\n");
  for(i=0; i<lemp->nsymbol; i++){
    int j;
    struct symbol *sp;

    sp = lemp->symbols[i];
    fprintf(fp, "  %3d: %s", i, sp->name);
    if( sp->type==NONTERMINAL ){
      fprintf(fp, ":");
      if( sp->lambda ){
        fprintf(fp, " <lambda>");
      }
      for(j=0; j<lemp->nterminal; j++){
        if( sp->firstset && SetFind(sp->firstset, j) ){
          fprintf(fp, " %s", lemp->symbols[j]->name);
        }
      }
    }
    if( sp->prec>=0 ) fprintf(fp," (precedence=%d)", sp->prec);
    fprintf(fp, "\n");
  }
  fprintf(fp, "----------------------------------------------------\n");
  fprintf(fp, "Syntax-only Symbols:\n");
  fprintf(fp, "The following symbols never carry semantic content.\n\n");
  for(i=n=0; i<lemp->nsymbol; i++){
    int w;
    struct symbol *sp = lemp->symbols[i];
    if( sp->bContent ) continue;
    w = (int)strlen(sp->name);
    if( n>0 && n+w>75 ){
      fprintf(fp,"\n");
      n = 0;
    }
    if( n>0 ){
      fprintf(fp, " ");
      n++;
    }
    fprintf(fp, "%s", sp->name);
    n += w;
  }
  if( n>0 ) fprintf(fp, "\n");
  fprintf(fp, "----------------------------------------------------\n");
  fprintf(fp, "Rules:\n");
  for(rp=lemp->rule; rp; rp=rp->next){
    fprintf(fp, "%4d: ", rp->iRule);
    rule_print(fp, rp);
    fprintf(fp,".");
    if( rp->precsym ){
      fprintf(fp," [%s precedence=%d]",
              rp->precsym->name, rp->precsym->prec);
    }
    fprintf(fp,"\n");
  }
  fclose(fp);
  return;
}